

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_sum.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  mbedtls_md_type_t *local_50;
  int *list;
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  int local_20;
  int exit_code;
  int i;
  int ret;
  char **argv_local;
  int argc_local;
  
  md_info._4_4_ = 1;
  mbedtls_md_init((mbedtls_md_context_t *)&list);
  if (argc == 1) {
    printf("print mode:  generic_sum <mbedtls_md> <file> <file> ...\n");
    printf("check mode:  generic_sum <mbedtls_md> -c <checksum file>\n");
    printf("\nAvailable message digests:\n");
    for (local_50 = (mbedtls_md_type_t *)mbedtls_md_list(); *local_50 != MBEDTLS_MD_NONE;
        local_50 = local_50 + 1) {
      md_ctx.hmac_ctx = mbedtls_md_info_from_type(*local_50);
      pcVar3 = mbedtls_md_get_name((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      printf("  %s\n",pcVar3);
    }
    argv_local._4_4_ = 1;
  }
  else {
    md_ctx.hmac_ctx = mbedtls_md_info_from_string(argv[1]);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      fprintf(_stderr,"Message Digest \'%s\' not found\n",argv[1]);
      argv_local._4_4_ = 1;
    }
    else {
      iVar1 = mbedtls_md_setup((mbedtls_md_context_t *)&list,(mbedtls_md_info_t *)md_ctx.hmac_ctx,0)
      ;
      if (iVar1 == 0) {
        exit_code = 0;
        if ((argc == 4) && (iVar1 = strcmp("-c",argv[2]), iVar1 == 0)) {
          generic_check((mbedtls_md_info_t *)md_ctx.hmac_ctx,argv[3]);
        }
        else {
          for (local_20 = 2; local_20 < argc; local_20 = local_20 + 1) {
            uVar2 = generic_print((mbedtls_md_info_t *)md_ctx.hmac_ctx,argv[local_20]);
            exit_code = uVar2 | exit_code;
          }
          md_info._4_4_ = (uint)(exit_code != 0);
        }
        mbedtls_md_free((mbedtls_md_context_t *)&list);
        argv_local._4_4_ = md_info._4_4_;
      }
      else {
        fprintf(_stderr,"Failed to initialize context.\n");
        argv_local._4_4_ = 1;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    mbedtls_md_init( &md_ctx );

    if( argc == 1 )
    {
        const int *list;

        mbedtls_printf( "print mode:  generic_sum <mbedtls_md> <file> <file> ...\n" );
        mbedtls_printf( "check mode:  generic_sum <mbedtls_md> -c <checksum file>\n" );

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        return( exit_code );
    }

    /*
     * Read the MD from the command line
     */
    md_info = mbedtls_md_info_from_string( argv[1] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[1] );
        return( exit_code );
    }
    if( mbedtls_md_setup( &md_ctx, md_info, 0 ) )
    {
        mbedtls_fprintf( stderr, "Failed to initialize context.\n" );
        return( exit_code );
    }

    ret = 0;
    if( argc == 4 && strcmp( "-c", argv[2] ) == 0 )
    {
        ret |= generic_check( md_info, argv[3] );
        goto exit;
    }

    for( i = 2; i < argc; i++ )
        ret |= generic_print( md_info, argv[i] );

    if ( ret == 0 )
        exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}